

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O1

bool __thiscall
phyr::Sphere::intersectRay(Sphere *this,Ray *ray,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  Transform *this_00;
  FPError a;
  FPError b_00;
  FPError c;
  bool bVar1;
  double *pdVar2;
  FPError *pFVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  FPError local_708;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  ulong uStack_6d0;
  double local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a0;
  double local_698;
  undefined8 uStack_690;
  double local_688;
  undefined4 uStack_680;
  undefined4 uStack_67c;
  double local_678;
  undefined8 uStack_670;
  double local_660;
  FPError t2;
  FPError t1;
  Ray lr;
  FPError local_5e8;
  double local_5c8;
  double dStack_5c0;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  FPError b;
  FPError local_548;
  FPError local_530;
  FPError local_518;
  FPError local_500;
  FPError local_4e8;
  FPError local_4d0;
  Vector3f rdErr;
  Normal3f local_468;
  Normal3f local_448;
  Vector3f local_428;
  Vector3f roErr;
  Point2f local_3e8;
  Vector3f local_3d8;
  Vector3f local_3b8;
  SurfaceInteraction local_398;
  SurfaceInteraction local_1e0;
  
  roErr.x = 0.0;
  roErr.y = 0.0;
  roErr.z = 0.0;
  rdErr.z = 0.0;
  rdErr.x = 0.0;
  rdErr.y = 0.0;
  Transform::operator()((this->super_Shape).worldToLocal,ray,&roErr,&rdErr);
  if ((roErr.x != 0.0) || (NAN(roErr.x))) {
    local_4d0.lBound = lr.o.x - roErr.x;
    if (-INFINITY < local_4d0.lBound) {
      dVar8 = (double)(~-(ulong)(local_4d0.lBound == 0.0) & (ulong)local_4d0.lBound |
                      -(ulong)(local_4d0.lBound == 0.0) & 0x8000000000000000);
      local_4d0.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_4d0.uBound;
    dVar8 = lr.o.x + roErr.x;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_4d0.lBound;
    dVar8 = lr.o.x;
  }
  *pdVar2 = dVar8;
  if ((roErr.y != 0.0) || (NAN(roErr.y))) {
    local_4e8.lBound = lr.o.y - roErr.y;
    if (-INFINITY < local_4e8.lBound) {
      dVar8 = (double)(~-(ulong)(local_4e8.lBound == 0.0) & (ulong)local_4e8.lBound |
                      -(ulong)(local_4e8.lBound == 0.0) & 0x8000000000000000);
      local_4e8.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_4e8.uBound;
    dVar8 = lr.o.y + roErr.y;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_4e8.lBound;
    dVar8 = lr.o.y;
  }
  *pdVar2 = dVar8;
  if ((roErr.z != 0.0) || (NAN(roErr.z))) {
    local_500.lBound = lr.o.z - roErr.z;
    if (-INFINITY < local_500.lBound) {
      dVar8 = (double)(~-(ulong)(local_500.lBound == 0.0) & (ulong)local_500.lBound |
                      -(ulong)(local_500.lBound == 0.0) & 0x8000000000000000);
      local_500.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_500.uBound;
    dVar8 = lr.o.z + roErr.z;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_500.lBound;
    dVar8 = lr.o.z;
  }
  *pdVar2 = dVar8;
  if ((rdErr.x != 0.0) || (NAN(rdErr.x))) {
    local_518.lBound = lr.d.x - rdErr.x;
    if (-INFINITY < local_518.lBound) {
      dVar8 = (double)(~-(ulong)(local_518.lBound == 0.0) & (ulong)local_518.lBound |
                      -(ulong)(local_518.lBound == 0.0) & 0x8000000000000000);
      local_518.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_518.uBound;
    dVar8 = lr.d.x + rdErr.x;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_518.lBound;
    dVar8 = lr.d.x;
  }
  *pdVar2 = dVar8;
  if ((rdErr.y != 0.0) || (NAN(rdErr.y))) {
    local_530.lBound = lr.d.y - rdErr.y;
    if (-INFINITY < local_530.lBound) {
      dVar8 = (double)(~-(ulong)(local_530.lBound == 0.0) & (ulong)local_530.lBound |
                      -(ulong)(local_530.lBound == 0.0) & 0x8000000000000000);
      local_530.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_530.uBound;
    dVar8 = lr.d.y + rdErr.y;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_530.lBound;
    dVar8 = lr.d.y;
  }
  *pdVar2 = dVar8;
  if ((rdErr.z != 0.0) || (NAN(rdErr.z))) {
    local_548.lBound = lr.d.z - rdErr.z;
    if (-INFINITY < local_548.lBound) {
      dVar8 = (double)(~-(ulong)(local_548.lBound == 0.0) & (ulong)local_548.lBound |
                      -(ulong)(local_548.lBound == 0.0) & 0x8000000000000000);
      local_548.lBound = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    }
    pdVar2 = &local_548.uBound;
    dVar8 = lr.d.z + rdErr.z;
    if (dVar8 < INFINITY) {
      dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
      dVar8 = (double)((-(ulong)(dVar8 < 0.0) | 1) + (long)dVar8);
    }
  }
  else {
    pdVar2 = &local_548.lBound;
    dVar8 = lr.d.z;
  }
  *pdVar2 = dVar8;
  FPError::operator*((FPError *)&local_398,&local_518,&local_518);
  FPError::operator*((FPError *)&local_1e0,&local_530,&local_530);
  local_6e8 = local_398.super_Interaction.p.y + local_1e0.super_Interaction.p.y;
  if (-INFINITY < local_6e8) {
    dVar8 = (double)(~-(ulong)(local_6e8 == 0.0) & (ulong)local_6e8 |
                    -(ulong)(local_6e8 == 0.0) & 0x8000000000000000);
    local_6e8 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_6d8 = local_398.super_Interaction.p.z + local_1e0.super_Interaction.p.z;
  dStack_6e0 = 0.0;
  if (local_6d8 < INFINITY) {
    local_6d8 = (double)(~-(ulong)(local_6d8 == 0.0) & (ulong)local_6d8);
    local_6d8 = (double)((-(ulong)(local_6d8 < 0.0) | 1) + (long)local_6d8);
  }
  uStack_6d0 = 0;
  local_698 = local_398.super_Interaction.p.x;
  local_688 = local_1e0.super_Interaction.p.x;
  FPError::operator*(&b,&local_548,&local_548);
  local_6e8 = local_6e8 + b.lBound;
  if (-INFINITY < local_6e8) {
    dVar8 = (double)(~-(ulong)(local_6e8 == 0.0) & (ulong)local_6e8 |
                    -(ulong)(local_6e8 == 0.0) & 0x8000000000000000);
    local_6e8 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    dStack_6e0 = 0.0;
  }
  local_6d8 = local_6d8 + b.uBound;
  if (local_6d8 < INFINITY) {
    local_6d8 = (double)(~-(ulong)(local_6d8 == 0.0) & (ulong)local_6d8);
    local_6d8 = (double)((-(ulong)(local_6d8 < 0.0) | 1) + (long)local_6d8);
    uStack_6d0 = 0;
  }
  local_660 = b.v;
  FPError::operator*(&t1,&local_4d0,&local_518);
  FPError::operator*(&t2,&local_4e8,&local_530);
  local_678 = t1.lBound + t2.lBound;
  if (-INFINITY < local_678) {
    dVar8 = (double)(~-(ulong)(local_678 == 0.0) & (ulong)local_678 |
                    -(ulong)(local_678 == 0.0) & 0x8000000000000000);
    local_678 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_6b8 = t1.uBound + t2.uBound;
  uStack_670 = 0;
  if (local_6b8 < INFINITY) {
    local_6b8 = (double)(~-(ulong)(local_6b8 == 0.0) & (ulong)local_6b8);
    local_6b8 = (double)((-(ulong)(local_6b8 < 0.0) | 1) + (long)local_6b8);
  }
  dStack_6b0 = 0.0;
  local_6c8 = t1.v;
  local_6a0 = t2.v;
  FPError::operator*(&local_708,&local_500,&local_548);
  local_1e0.super_Interaction.p.y = local_678 + local_708.lBound;
  if (-INFINITY < local_1e0.super_Interaction.p.y) {
    dVar8 = (double)(~-(ulong)(local_1e0.super_Interaction.p.y == 0.0) &
                     (ulong)local_1e0.super_Interaction.p.y |
                    -(ulong)(local_1e0.super_Interaction.p.y == 0.0) & 0x8000000000000000);
    local_1e0.super_Interaction.p.y = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_1e0.super_Interaction.p.z = local_6b8 + local_708.uBound;
  if (local_1e0.super_Interaction.p.z < INFINITY) {
    local_1e0.super_Interaction.p.z =
         (double)(~-(ulong)(local_1e0.super_Interaction.p.z == 0.0) &
                 (ulong)local_1e0.super_Interaction.p.z);
    local_1e0.super_Interaction.p.z =
         (double)((-(ulong)(local_1e0.super_Interaction.p.z < 0.0) | 1) +
                 (long)local_1e0.super_Interaction.p.z);
  }
  local_1e0.super_Interaction.p.x = local_6c8 + local_6a0 + local_708.v;
  local_398.super_Interaction.p.z = 2.0;
  local_398.super_Interaction.p.x = 2.0;
  local_398.super_Interaction.p.y = 2.0;
  FPError::operator*(&b,(FPError *)&local_398,(FPError *)&local_1e0);
  FPError::operator*((FPError *)&local_398,&local_4d0,&local_4d0);
  FPError::operator*((FPError *)&local_1e0,&local_4e8,&local_4e8);
  local_678 = local_398.super_Interaction.p.y + local_1e0.super_Interaction.p.y;
  if (-INFINITY < local_678) {
    dVar8 = (double)(~-(ulong)(local_678 == 0.0) & (ulong)local_678 |
                    -(ulong)(local_678 == 0.0) & 0x8000000000000000);
    local_678 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  local_6c8 = local_398.super_Interaction.p.z + local_1e0.super_Interaction.p.z;
  uStack_670 = 0;
  if (local_6c8 < INFINITY) {
    local_6c8 = (double)(~-(ulong)(local_6c8 == 0.0) & (ulong)local_6c8);
    local_6c8 = (double)((-(ulong)(local_6c8 < 0.0) | 1) + (long)local_6c8);
  }
  uStack_6c0 = 0;
  local_6b8 = local_398.super_Interaction.p.x;
  local_6a0 = local_1e0.super_Interaction.p.x;
  FPError::operator*(&t1,&local_500,&local_500);
  local_678 = local_678 + t1.lBound;
  if (-INFINITY < local_678) {
    dVar8 = (double)(~-(ulong)(local_678 == 0.0) & (ulong)local_678 |
                    -(ulong)(local_678 == 0.0) & 0x8000000000000000);
    local_678 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
    uStack_670 = 0;
  }
  local_6c8 = local_6c8 + t1.uBound;
  if (local_6c8 < INFINITY) {
    local_6c8 = (double)(~-(ulong)(local_6c8 == 0.0) & (ulong)local_6c8);
    local_6c8 = (double)((-(ulong)(local_6c8 < 0.0) | 1) + (long)local_6c8);
    uStack_6c0 = 0;
  }
  local_698 = local_698 + local_688;
  local_6b8 = local_6b8 + local_6a0;
  local_688 = t1.v;
  local_708.v = this->radius;
  local_708.lBound = local_708.v;
  local_708.uBound = local_708.v;
  local_5e8.v = local_708.v;
  local_5e8.lBound = local_708.v;
  local_5e8.uBound = local_708.v;
  FPError::operator*(&t2,&local_708,&local_5e8);
  dVar8 = local_678 - t2.lBound;
  if (-INFINITY < dVar8) {
    dVar8 = (double)(~-(ulong)(dVar8 == 0.0) & (ulong)dVar8 |
                    -(ulong)(dVar8 == 0.0) & 0x8000000000000000);
    dVar8 = (double)((long)dVar8 + (ulong)(dVar8 <= 0.0) * 2 + -1);
  }
  dVar9 = local_6c8 - t2.uBound;
  if (dVar9 < INFINITY) {
    dVar9 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9);
    dVar9 = (double)((-(ulong)(dVar9 < 0.0) | 1) + (long)dVar9);
  }
  a.lBound = local_6e8;
  a.v = local_698 + local_660;
  a.uBound = local_6d8;
  b_00.lBound = b.lBound;
  b_00.v = b.v;
  b_00.uBound = b.uBound;
  c.lBound = dVar8;
  c.v = (local_6b8 + local_688) - t2.v;
  c.uBound = dVar9;
  bVar1 = solveQuadraticSystem(a,b_00,c,&t1,&t2);
  if (bVar1) {
    if (lr.tMax < t1.uBound) {
      return false;
    }
    if (t2.lBound <= 0.0) {
      return false;
    }
    pFVar3 = &t1;
    if ((0.0 < t1.lBound) || (pFVar3 = &t2, t1.uBound = t2.uBound, t2.uBound <= lr.tMax)) {
      local_6d8 = pFVar3->v;
      local_708.uBound = lr.d.z * local_6d8 + lr.o.z;
      local_708.v = local_6d8 * lr.d.x + lr.o.x;
      local_708.lBound = local_6d8 * lr.d.y + lr.o.y;
      dVar8 = local_708.uBound * local_708.uBound +
              local_708.v * local_708.v + local_708.lBound * local_708.lBound;
      if (dVar8 < 0.0) {
        uStack_6d0 = 0;
        uStack_690 = 0;
        local_6e8 = t1.uBound;
        local_698 = this->radius;
        dVar8 = sqrt(dVar8);
        dVar9 = local_698;
        t1.uBound = local_6e8;
      }
      else {
        dVar8 = SQRT(dVar8);
        dVar9 = this->radius;
      }
      dVar9 = dVar9 / dVar8;
      local_708.v = dVar9 * local_708.v;
      local_708.lBound = dVar9 * local_708.lBound;
      local_708.uBound = dVar9 * local_708.uBound;
      dVar8 = this->radius;
      if (((-dVar8 < this->zMin) && (local_708.uBound < this->zMin)) ||
         ((this->zMax < dVar8 && (this->zMax < local_708.uBound)))) {
        if ((local_6d8 == t2.v) && (!NAN(local_6d8) && !NAN(t2.v))) {
          return false;
        }
        if (lr.tMax < t1.uBound) {
          return false;
        }
        local_708.uBound = lr.d.z * t2.v + lr.o.z;
        local_708.v = t2.v * lr.d.x + lr.o.x;
        local_708.lBound = t2.v * lr.d.y + lr.o.y;
        dVar9 = local_708.uBound * local_708.uBound +
                local_708.v * local_708.v + local_708.lBound * local_708.lBound;
        if (dVar9 < 0.0) {
          dStack_6e0 = 0.0;
          local_6d8 = t2.v;
          uStack_6d0 = 0;
          local_6e8 = dVar8;
          dVar9 = sqrt(dVar9);
          t2.v = local_6d8;
          dVar8 = local_6e8;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar8 = dVar8 / dVar9;
        local_708.v = dVar8 * local_708.v;
        local_708.lBound = dVar8 * local_708.lBound;
        local_708.uBound = dVar8 * local_708.uBound;
        if ((-this->radius < this->zMin) && (local_708.uBound < this->zMin)) {
          return false;
        }
        local_6d8 = t2.v;
        if ((this->zMax < this->radius) && (this->zMax < local_708.uBound)) {
          return false;
        }
      }
      *t0 = local_6d8;
      if ((((local_708.v == 0.0) && (!NAN(local_708.v))) && (local_708.lBound == 0.0)) &&
         (!NAN(local_708.lBound))) {
        local_708.v = this->radius * 9.999999747378752e-06;
      }
      local_6d8 = this->thetaMax - this->thetaMin;
      uStack_6d0 = 0;
      dVar8 = atan2(local_708.lBound,local_708.v);
      local_698 = (double)(~-(ulong)(dVar8 < 0.0) & (ulong)dVar8 |
                          (ulong)(dVar8 + 6.283185307179586) & -(ulong)(dVar8 < 0.0));
      uStack_690 = 0;
      dVar9 = local_708.uBound / this->radius;
      dVar8 = -1.0;
      if (-1.0 <= dVar9) {
        dVar8 = dVar9;
      }
      dVar9 = 1.0;
      if (dVar8 <= 1.0) {
        dVar9 = dVar8;
      }
      local_6e8 = acos(dVar9);
      local_678 = local_6e8 - this->thetaMin;
      dVar8 = local_708.v * local_708.v + local_708.lBound * local_708.lBound;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dStack_6e0 = 0.0;
      local_6b8 = local_708.v;
      dStack_6b0 = local_708.lBound;
      local_5e8.v = local_708.lBound * -6.283185307179586;
      local_5e8.lBound = local_708.v * 6.283185307179586;
      local_5e8.uBound = 0.0;
      local_688 = -this->radius;
      uStack_680 = 0;
      uStack_67c = 0x80000000;
      local_6c8 = local_708.uBound;
      uStack_6c0 = 0;
      dVar9 = local_6e8;
      local_6e8 = 1.0 / dVar8;
      dVar8 = sin(dVar9);
      local_428.z = dVar8 * local_688 * local_6d8;
      dVar10 = local_6e8 * local_6b8;
      dStack_6e0 = local_6e8 * dStack_6b0;
      local_428.x = local_6d8 * local_6c8 * dVar10;
      dStack_5c0 = local_6d8 * local_6c8 * dStack_6e0;
      local_660 = local_708.v * -39.47841760435743;
      local_6a0 = local_708.lBound * -39.47841760435743;
      dVar11 = -dStack_6e0;
      dStack_6b0 = (double)(uStack_6d0 ^ 0x8000000000000000);
      local_6b8 = -local_6d8 * local_6d8;
      local_688 = local_708.v * local_6b8;
      local_6c8 = local_708.lBound * local_6b8;
      local_6b8 = local_6b8 * local_708.uBound;
      local_448.x = 0.0;
      local_448.y = 0.0;
      local_468.x = 0.0;
      local_468.y = 0.0;
      dVar13 = local_5e8.uBound * local_5e8.uBound +
               local_5e8.v * local_5e8.v + local_5e8.lBound * local_5e8.lBound;
      dVar9 = local_5e8.uBound * local_428.z +
              local_5e8.v * local_428.x + dStack_5c0 * local_5e8.lBound;
      local_5c8 = local_428.z * local_428.z + local_428.x * local_428.x + dStack_5c0 * dStack_5c0;
      dVar8 = local_5e8.lBound * local_428.z - dStack_5c0 * local_5e8.uBound;
      dVar12 = local_6d8 * local_708.uBound * 6.283185307179586;
      local_6e8 = dVar10 * dVar12;
      dVar14 = local_5e8.uBound * local_428.x - local_428.z * local_5e8.v;
      dVar15 = dStack_5c0 * local_5e8.v - local_428.x * local_5e8.lBound;
      dVar4 = dVar15 * dVar15 + dVar8 * dVar8 + dVar14 * dVar14;
      local_448.z = 0.0;
      local_468.z = 0.0;
      local_428.y = dStack_5c0;
      if (dVar4 < 0.0) {
        local_5b0 = dVar8;
        local_5a8 = dVar14;
        local_5a0 = dVar9;
        local_598 = dVar13;
        dVar4 = sqrt(dVar4);
        dVar9 = local_5a0;
        dVar13 = local_598;
        dVar14 = local_5a8;
        dVar8 = local_5b0;
        dVar7 = local_6e8;
      }
      else {
        dVar4 = SQRT(dVar4);
        dVar7 = local_6e8;
        local_6e8 = dVar10;
      }
      dVar4 = 1.0 / dVar4;
      dVar8 = dVar8 * dVar4;
      dVar14 = dVar14 * dVar4;
      dVar15 = dVar15 * dVar4;
      dVar4 = dVar15 * -0.0 + local_660 * dVar8 + local_6a0 * dVar14;
      dVar11 = dVar12 * 0.0 * dVar15 + dVar11 * dVar12 * dVar8 + dVar7 * dVar14;
      dVar12 = dVar15 * local_6b8 + dVar8 * local_688 + local_6c8 * dVar14;
      dVar14 = 1.0 / (dVar13 * local_5c8 - dVar9 * dVar9);
      dVar10 = (dVar11 * dVar9 - local_5c8 * dVar4) * dVar14;
      dVar8 = (dVar4 * dVar9 - dVar13 * dVar11) * dVar14;
      local_448.z = local_428.z * dVar8 + local_5e8.uBound * dVar10;
      local_448.x = dVar8 * local_428.x + dVar10 * local_5e8.v;
      local_448.y = dVar8 * local_428.y + dVar10 * local_5e8.lBound;
      dVar8 = (dVar11 * dVar12 - local_5c8 * dVar11) * dVar14;
      dVar14 = (dVar11 * dVar9 - dVar12 * dVar13) * dVar14;
      local_468.z = local_428.z * dVar14 + local_5e8.uBound * dVar8;
      local_468.x = dVar14 * local_428.x + dVar8 * local_5e8.v;
      local_468.y = dVar14 * local_428.y + dVar8 * local_5e8.lBound;
      local_3b8.z = ABS(local_708.uBound) * 5.551115123125786e-16;
      local_3b8.x = ABS(local_708.v) * 5.551115123125786e-16;
      local_3b8.y = ABS(local_708.lBound) * 5.551115123125786e-16;
      local_3d8.z = -lr.d.z;
      local_3d8.x = -lr.d.x;
      local_3d8.y = -lr.d.y;
      this_00 = (this->super_Shape).localToWorld;
      auVar6._8_8_ = local_678;
      auVar6._0_8_ = local_698;
      auVar5._8_8_ = local_6d8;
      auVar5._0_8_ = 0x401921fb54442d18;
      local_3e8 = (Point2f)divpd(auVar6,auVar5);
      SurfaceInteraction::SurfaceInteraction
                (&local_1e0,(Point3f *)&local_708,&local_3d8,&local_3b8,&local_3e8,
                 (Vector3f *)&local_5e8,&local_428,&local_448,&local_468,&this->super_Shape);
      Transform::operator()(&local_398,this_00,&local_1e0);
      memcpy(si,&local_398,0x1b8);
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, Real* t0, SurfaceInteraction* si,
                          bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError tt0 = t1;
    if (tt0.lowerBound() <= 0) {
        tt0 = t2; if (tt0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(tt0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (tt0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (tt0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        tt0 = t2; hpt = lr(Real(tt0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    *t0 = Real(tt0);
    Real twoPi = 2 * Pi, delTheta = thetaMax - thetaMin;

    // Make sure phi = atan(y / x) doesn't result in NaN
    if (hpt.x == 0 && hpt.y == 0) hpt.x = 1e-5f * radius;
    // Compute phi and theta values
    Real phi = std::atan2(hpt.y, hpt.x);
    // Cover the full range [0, 2*Pi] in a continuous cycle
    if (phi < 0) phi += twoPi;
    Real theta = std::acos(clamp(hpt.z / radius, -1, 1));

    // Compute (u, v) parameters from phi and theta
    Real u = phi / twoPi;
    Real v = (theta - thetaMin) / delTheta;

    // Compute partial derivatives for the sphere
    Real hypot = std::sqrt(hpt.x * hpt.x + hpt.y * hpt.y);
    Real invHypot = 1 / hypot;
    Real cosPhi = hpt.x * invHypot, sinPhi = hpt.y * invHypot;

    Vector3f dpdu = Vector3f(-twoPi * hpt.y, twoPi * hpt.x, 0);
    Vector3f dpdv = delTheta * Vector3f(hpt.z * cosPhi, hpt.z * sinPhi, -radius * std::sin(theta));

    // Compute second derivatives
    Vector3f d2pduu = -twoPi * twoPi * Vector3f(hpt.x, hpt.y, 0);
    Vector3f d2pduv = delTheta * hpt.z * twoPi * Vector3f(-sinPhi, cosPhi, 0);
    Vector3f d2pdvv = -delTheta * delTheta * Vector3f(hpt.x, hpt.y, hpt.z);

    // Compute surface normals
    Normal3f dndu, dndv;
    solveSurfaceNormal(dpdu, dpdv, d2pduu,d2pduv, d2pdvv, &dndu, &dndv);

    // Compute error bounds for ray-sphere intersection
    Vector3f pfError = abs(Vector3f(hpt)) * gamma(5);
    // Initiate the SurfaceInteraction object
    *si = (*localToWorld)(SurfaceInteraction(hpt, -lr.d, pfError,
                                             Point2f(u, v), dpdu, dpdv, dndu, dndv, this));

    return true;
}